

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cc
# Opt level: O2

Renderer * __thiscall
SDL2pp::Renderer::FillCopy
          (Renderer *this,Texture *texture,Optional<Rect> *srcrect,Optional<Rect> *dstrect,
          Point *offset,int flip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  value_type *pvVar5;
  undefined4 extraout_var;
  uint uVar6;
  int x;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  anon_union_16_2_ddbcb137_for___optional_storage<SDL2pp::Rect,_true>_2 local_98;
  undefined1 local_88;
  anon_union_16_2_ddbcb137_for___optional_storage<SDL2pp::Rect,_true>_2 local_84;
  undefined1 local_74;
  ulong local_70;
  int local_68;
  uint local_64;
  Texture *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  anon_union_8_2_ddbcb137_for___optional_storage<SDL2pp::Point,_true>_2 local_3c;
  undefined1 local_34;
  
  if ((srcrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar5 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(srcrect);
    local_a8 = (pvVar5->super_SDL_Rect).x;
    local_b0 = (pvVar5->super_SDL_Rect).y;
    iVar1 = (pvVar5->super_SDL_Rect).w;
    local_70 = (ulong)(uint)(pvVar5->super_SDL_Rect).h;
  }
  else {
    iVar1 = Texture::GetWidth(texture);
    iVar2 = Texture::GetHeight(texture);
    local_70 = CONCAT44(extraout_var,iVar2);
    local_b0 = 0;
    local_a8 = 0;
  }
  local_60 = texture;
  if ((dstrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar5 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(dstrect);
    local_ac = (pvVar5->super_SDL_Rect).x;
    local_b4 = (pvVar5->super_SDL_Rect).y;
    iVar2 = (pvVar5->super_SDL_Rect).w;
    local_68 = (pvVar5->super_SDL_Rect).h;
  }
  else {
    iVar2 = GetOutputWidth(this);
    local_68 = GetOutputHeight(this);
    local_b4 = 0;
    local_ac = 0;
  }
  uVar7 = (offset->super_SDL_Point).x;
  local_58 = (ulong)uVar7;
  uVar6 = (offset->super_SDL_Point).y;
  local_50 = (ulong)uVar6;
  if (uVar7 + iVar1 == 0 || SCARRY4(uVar7,iVar1) != (int)(uVar7 + iVar1) < 0) {
    local_58 = (long)(int)uVar7 % (long)iVar1 & 0xffffffff;
  }
  if (0 < (int)local_58) {
    local_58 = (ulong)((((int)local_58 + -1 + iVar1) % iVar1 - iVar1) + 1);
  }
  iVar11 = (int)local_70;
  if (uVar6 + iVar11 == 0 || SCARRY4(uVar6,iVar11) != (int)(uVar6 + iVar11) < 0) {
    local_50 = (long)(int)uVar6 % (long)iVar11 & 0xffffffff;
  }
  if (0 < (int)local_50) {
    local_50 = (ulong)((((int)local_50 + -1 + iVar11) % iVar11 - iVar11) + 1);
  }
  for (; uVar7 = (uint)local_50, (int)uVar7 < local_68;
      local_50 = (ulong)(uint)((int)local_50 + (int)local_70)) {
    uVar10 = (int)uVar7 >> 0x1f & uVar7;
    uVar6 = local_b0 - uVar10;
    local_48 = (ulong)uVar6;
    iVar11 = uVar10 + (int)local_70;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = local_50;
    }
    iVar3 = ((int)uVar8 - local_68) + iVar11;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar11 = iVar11 - iVar3;
    iVar3 = (int)uVar8 + local_b4;
    local_64 = ((int)local_70 - uVar6) - iVar11;
    if ((flip & 2U) == 0) {
      local_64 = uVar6;
    }
    uVar8 = local_58 & 0xffffffff;
    while (uVar7 = (uint)uVar8, (int)uVar7 < iVar2) {
      uVar6 = (int)uVar7 >> 0x1f & uVar7;
      local_84.__val_.super_SDL_Rect.x = local_a8 - uVar6;
      iVar4 = uVar6 + iVar1;
      uVar6 = 0;
      if (0 < (int)uVar7) {
        uVar6 = uVar7;
      }
      iVar9 = (uVar6 - iVar2) + iVar4;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      local_98.__val_.super_SDL_Rect.w = iVar4 - iVar9;
      local_98.__val_.super_SDL_Rect.x = uVar6 + local_ac;
      local_98.__val_.super_SDL_Rect.y = iVar3;
      local_98.__val_.super_SDL_Rect.h = iVar11;
      local_84.__val_.super_SDL_Rect.w = local_98.__val_.super_SDL_Rect.w;
      local_84.__val_.super_SDL_Rect.h = iVar11;
      if (flip == 0) {
        local_84.__val_.super_SDL_Rect.y = (int)local_48;
        local_74 = 1;
        local_88 = 1;
        Copy(this,local_60,(Optional<Rect> *)&local_84.__val_,(Optional<Rect> *)&local_98.__val_);
      }
      else {
        iVar4 = (iVar1 - local_84.__val_.super_SDL_Rect.x) - local_98.__val_.super_SDL_Rect.w;
        if ((flip & 1U) == 0) {
          iVar4 = local_84.__val_.super_SDL_Rect.x;
        }
        local_84.__val_.super_SDL_Rect.y = local_64;
        local_74 = 1;
        local_88 = 1;
        local_3c.__null_state_ = '\0';
        local_34 = 0;
        local_84.__val_.super_SDL_Rect.x = iVar4;
        Copy(this,local_60,(Optional<Rect> *)&local_84.__val_,(Optional<Rect> *)&local_98.__val_,0.0
             ,(Optional<Point> *)&local_3c.__val_,flip);
      }
      uVar8 = (ulong)(uVar7 + iVar1);
    }
  }
  return this;
}

Assistant:

Renderer& Renderer::FillCopy(Texture& texture, const Optional<Rect>& srcrect, const Optional<Rect>& dstrect, const Point& offset, int flip) {
	// resolve rectangles
	Rect src = srcrect ? *srcrect : Rect(0, 0, texture.GetWidth(), texture.GetHeight());
	Rect dst = dstrect ? *dstrect : Rect(0, 0, GetOutputWidth(), GetOutputHeight());

	// rectangle for single tile
	Rect start_tile(
			offset.x,
			offset.y,
			src.w,
			src.h
		);

	// ensure tile is leftmost and topmost
	if (start_tile.x + start_tile.w <= 0)
		start_tile.x += (-start_tile.x) / start_tile.w * start_tile.w;
	if (start_tile.x > 0)
		start_tile.x -= (start_tile.x + start_tile.w - 1) / start_tile.w * start_tile.w;

	if (start_tile.y + start_tile.h <= 0)
		start_tile.y += (-start_tile.y) / start_tile.h * start_tile.h;
	if (start_tile.y > 0)
		start_tile.y -= (start_tile.y + start_tile.h - 1) / start_tile.h * start_tile.h;

	// paint tile array
	for (int y = start_tile.y; y < dst.h; y += start_tile.h) {
		for (int x = start_tile.x; x < dst.w; x += start_tile.w) {
			Rect tile_src = src;
			Rect tile_dst(x, y, start_tile.w, start_tile.h);

			// clamp with dstrect
			int xunderflow = -x;
			if (xunderflow > 0) {
				tile_src.w -= xunderflow;
				tile_src.x += xunderflow;
				tile_dst.w -= xunderflow;
				tile_dst.x += xunderflow;
			}

			int yunderflow = -y;
			if (yunderflow > 0) {
				tile_src.h -= yunderflow;
				tile_src.y += yunderflow;
				tile_dst.h -= yunderflow;
				tile_dst.y += yunderflow;
			}

			int xoverflow = tile_dst.x + tile_dst.w - dst.w;
			if (xoverflow > 0) {
				tile_src.w -= xoverflow;
				tile_dst.w -= xoverflow;
			}

			int yoverflow = tile_dst.y + tile_dst.h - dst.h;
			if (yoverflow > 0) {
				tile_src.h -= yoverflow;
				tile_dst.h -= yoverflow;
			}

			// make tile_dst absolute
			tile_dst.x += dst.x;
			tile_dst.y += dst.y;

			if (flip != 0) {
				// mirror tile_src inside src to take flipping into account
				if (flip & SDL_FLIP_HORIZONTAL)
					tile_src.x = src.w - tile_src.x - tile_src.w;

				if (flip & SDL_FLIP_VERTICAL)
					tile_src.y = src.h - tile_src.y - tile_src.h;

				Copy(texture, tile_src, tile_dst, 0.0, NullOpt, flip);
			} else {
				Copy(texture, tile_src, tile_dst);
			}
		}
	}
	return *this;
}